

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeCode::saveXml(TypeCode *this,ostream *s)

{
  std::operator<<(s,"<type");
  Datatype::saveXmlBasic(&this->super_Datatype,s);
  std::operator<<(s,">\n");
  if (this->proto != (FuncProto *)0x0) {
    FuncProto::saveXml(this->proto,s);
  }
  std::operator<<(s,"</type>");
  return;
}

Assistant:

void TypeCode::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  s << ">\n";
  if (proto != (FuncProto *)0)
    proto->saveXml(s);
  s << "</type>";
}